

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form2_BitwiseOr(BitwiseOrForm2 BitwiseOr)

{
  bool bVar1;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  ImageTemplate<unsigned_char> local_30;
  
  Unit_Test::intensityArray(&intensity,3);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_30,0,0,'\x01','\x01');
  Test_Helper::uniformImages(&image,&intensity,&local_30);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_30);
  (*BitwiseOr)(image.
               super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               image.
               super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1,
               image.
               super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 2);
  bVar1 = Unit_Test::verifyImage
                    (image.
                     super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 2,
                     intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[1] |
                     *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&image);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar1;
}

Assistant:

bool form2_BitwiseOr(BitwiseOrForm2 BitwiseOr)
    {
        const std::vector < uint8_t > intensity = intensityArray( 3 );
        std::vector < PenguinV_Image::Image > image = uniformImages( intensity );

        BitwiseOr( image[0], image[1], image[2] );

        return verifyImage( image[2], intensity[0] | intensity[1] );
    }